

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall
DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
::ascend(DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
         *this,uint i)

{
  pointer pHVar1;
  mapped_type *pmVar2;
  uint i_00;
  ulong uVar3;
  uint j;
  
  uVar3 = (ulong)i;
  while( true ) {
    pHVar1 = (this->heap).
             super__Vector_base<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry,_std::allocator<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    i_00 = (uint)uVar3;
    if ((i_00 == 0) ||
       (j = i_00 - 1 >> 1,
       pHVar1[uVar3].priority < pHVar1[j].priority || pHVar1[uVar3].priority == pHVar1[j].priority))
    break;
    swap(this,i_00,j);
    uVar3 = (ulong)j;
  }
  pmVar2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->index,&pHVar1[uVar3].data);
  *pmVar2 = i_00;
  return;
}

Assistant:

void
DynamicHeap<T, P, C, M>::ascend(unsigned int i)
{
  for (unsigned int j; i && !ordered(j = parent(i), i); i = j)
    swap(i, j);
  index[heap[i].data] = i;
}